

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error tilde<39>(context *ctx,token *token,opcode *op)

{
  opcode *in_RCX;
  token local_48;
  
  if (op[1].reuse == 8) {
    opcode::add_bits(in_RCX,0x8000000000);
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
  }
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(tilde)
{
    if (token.type == token_type::tilde) {
        op.add_bits(1ULL << address);
        token = ctx.tokenize();
    }
    return {};
}